

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O0

BinaryExpr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_char_(&)[64]>
* __thiscall
Catch::ExprLhs<std::__cxx11::string_const&>::operator==
          (ExprLhs<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
           *this,char (*rhs) [64])

{
  StringRef op;
  bool comparisonResult;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  BinaryExpr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_char_(&)[64]>
  *in_RDI;
  char (*in_stack_ffffffffffffffa8) [64];
  undefined7 in_stack_ffffffffffffffb8;
  char *pcVar1;
  BinaryExpr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_char_(&)[64]>
  *pBVar2;
  
  pBVar2 = in_RDI;
  comparisonResult = compareEqual<std::__cxx11::string,char[64]>(in_RSI,in_stack_ffffffffffffffa8);
  pcVar1 = *(char **)in_RSI;
  StringRef::StringRef
            ((StringRef *)in_RDI,(char *)CONCAT17(comparisonResult,in_stack_ffffffffffffffb8));
  op.m_size = (size_type)pBVar2;
  op.m_start = pcVar1;
  BinaryExpr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_char_(&)[64]>
  ::BinaryExpr(in_RDI,comparisonResult,in_RSI,op,in_stack_ffffffffffffffa8);
  return pBVar2;
}

Assistant:

auto operator == ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { compareEqual( m_lhs, rhs ), m_lhs, "==", rhs };
        }